

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  size_t len;
  
  uVar1 = s->_M_string_length;
  if (uVar1 < 4) {
LAB_002edc7c:
    if (4 < uVar1) {
      iVar3 = strcmp((s->_M_dataplus)._M_p + (uVar1 - 5),"/sbin");
      if (iVar3 == 0) goto LAB_002edcb7;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  else {
    iVar3 = strcmp((s->_M_dataplus)._M_p + (uVar1 - 4),"/bin");
    if (iVar3 != 0) goto LAB_002edc7c;
LAB_002edcb7:
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}